

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

int arti_invoke(obj *obj)

{
  char *pcVar1;
  uchar uVar2;
  char cVar3;
  schar sVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  obj *poVar13;
  nh_menuitem *items;
  int *piVar14;
  artifact *paVar15;
  long lVar16;
  obj *poVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  byte bVar22;
  boolean unused_known;
  xchar local_b1;
  d_level *local_b0;
  long local_a8;
  nh_menuitem *local_a0;
  obj pseudo;
  
  uVar7 = moves;
  bVar22 = 0;
  if ((obj == (obj *)0x0) || (lVar10 = (long)obj->oartifact, lVar10 == 0)) {
LAB_0014aa51:
    cVar3 = obj->oclass;
    if ((cVar3 == '\x06') || (cVar3 == '\r')) {
      iVar6 = dorub(obj);
      return iVar6;
    }
    if (cVar3 == '\v') {
      iVar6 = do_break_wand(obj);
      return iVar6;
    }
    if ((ushort)obj->otyp - 0xd8 < 2) {
      iVar6 = invoke_amulet(obj);
      return iVar6;
    }
    if (obj->otyp == 0xec) {
      use_crystal_ball(obj);
      return 1;
    }
    pcVar11 = "Nothing happens.";
    goto LAB_0014b168;
  }
  uVar19 = (ulong)artilist[lVar10].inv_prop;
  if (uVar19 == 0) goto LAB_0014aa51;
  paVar15 = artilist + lVar10;
  if (artilist[lVar10].inv_prop < 0x43) {
    uVar7 = u.uprops[uVar19].extrinsic;
    uVar8 = u.uprops[uVar19].intrinsic;
    uVar20 = uVar7 ^ 0x2000;
    u.uprops[uVar19].extrinsic = uVar20;
    uVar9 = moves;
    if ((uVar20 >> 0xd & 1) == 0) {
      iVar6 = rnz((int)obj);
      obj->age = iVar6 + uVar9;
    }
    else if (moves < (uint)obj->age) {
      u.uprops[uVar19].extrinsic = uVar7;
      goto LAB_0014ab33;
    }
    if (((uVar20 & 0xffffdfff) == 0) && (uVar8 == 0)) {
      uVar2 = paVar15->inv_prop;
      if (uVar2 != '\r') {
        if (uVar2 == '\x12') {
          if ((uVar20 >> 0xd & 1) == 0) {
            float_down(0x10ffffff,0x2000);
            return 1;
          }
          float_up();
          spoteffects('\0');
          return 1;
        }
        if (uVar2 != '\x15') {
          return 1;
        }
        if ((uVar20 >> 0xd & 1) == 0) {
          pcVar11 = "You feel the tension decrease around you.";
        }
        else {
          pcVar11 = "You feel like a rabble-rouser.";
        }
        goto LAB_0014b168;
      }
      if (u.uprops[0xd].blocked == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014ac16;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014ac0d;
LAB_0014b1fc:
          newsym((int)u.ux,(int)u.uy);
          if ((uVar20 >> 0xd & 1) != 0) {
            pcVar11 = "strange";
            if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
              if (u.umonnum == u.umonster) {
                pcVar11 = "normal";
              }
              else {
                bVar5 = dmgtype(youmonst.data,0x24);
                pcVar11 = "strange";
                if (bVar5 == '\0') {
                  pcVar11 = "normal";
                }
              }
            }
            pline("Your body takes on a %s transparency...",pcVar11);
            return 1;
          }
          pcVar11 = "Your body seems to unfade...";
          goto LAB_0014b168;
        }
LAB_0014ac0d:
        if (ublindf != (obj *)0x0) {
LAB_0014ac16:
          if (ublindf->oartifact == '\x1d') goto LAB_0014b1fc;
        }
      }
    }
    goto LAB_0014b15b;
  }
  if (moves < (uint)obj->age) {
LAB_0014ab33:
    pcVar11 = xname(obj);
    pcVar11 = the(pcVar11);
    pcVar12 = otense(obj,"are");
    pline("You feel that %s %s ignoring you.",pcVar11,pcVar12);
    uVar7 = dice(3,10);
    goto LAB_0014ab74;
  }
  iVar6 = rnz((int)obj);
  obj->age = iVar6 + uVar7;
  uVar7 = u.ucreamed;
  switch(paVar15->inv_prop) {
  case 'C':
    poVar13 = &zeroobj;
    poVar17 = &pseudo;
    for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
      poVar17->nobj = poVar13->nobj;
      poVar13 = (obj *)((long)poVar13 + ((ulong)bVar22 * -2 + 1) * 8);
      poVar17 = (obj *)((long)poVar17 + (ulong)bVar22 * -0x10 + 8);
    }
    pseudo.otyp = 0x159;
    seffects(&pseudo,&unused_known);
    break;
  case 'D':
    uVar19 = (ulong)u.ucreamed;
    iVar6 = u.mhmax - u.mh;
    if (u.umonnum == u.umonster) {
      iVar6 = u.uhpmax - u.uhp;
    }
    iVar21 = iVar6 + 1;
    if ((((0xfffffffc < iVar6 - 1U) && (u.uprops[0x1d].intrinsic == 0)) &&
        (u.uprops[0x3a].intrinsic == 0)) && (u.uprops[0x1e].intrinsic <= u.ucreamed))
    goto LAB_0014b15b;
    pline("You feel better.",(ulong)(iVar6 - 1U),(long)iVar21 % 2 & 0xffffffff);
    if (1 < iVar21) {
      piVar14 = &u.mh;
      if (u.umonnum == u.umonster) {
        piVar14 = &u.uhp;
      }
      *piVar14 = *piVar14 + iVar21 / 2;
    }
    if (u.uprops[0x1d].intrinsic != 0) {
      make_sick(0,(char *)0x0,'\0',3);
    }
    if (u.uprops[0x3a].intrinsic != 0) {
      u.uprops[0x3a].intrinsic = 0;
    }
    if (uVar7 < u.uprops[0x1e].intrinsic) {
      make_blinded(uVar19,'\0');
    }
    goto LAB_0014b111;
  case 'E':
    iVar6 = (u.uenmax - u.uen) + 1;
    if (iVar6 < 0xf2) {
      iVar21 = iVar6 / 2;
      if (iVar6 < 0x18) {
        iVar21 = u.uenmax - u.uen;
      }
      if (iVar21 == 0) goto LAB_0014b15b;
    }
    else {
      iVar21 = 0x78;
    }
    pline("You feel re-energized.");
    u.uen = u.uen + iVar21;
LAB_0014b111:
    iflags.botl = '\x01';
    break;
  case 'F':
    iVar6 = untrap('\x01');
    if (iVar6 == 0) {
      obj->age = 0;
      return 0;
    }
    return 1;
  case 'G':
    poVar13 = getobj("\x13\x14","charge",(obj **)0x0);
    if (poVar13 == (obj *)0x0) {
      obj->age = 0;
      return 0;
    }
    if (((*(uint *)&obj->field_0x4a & 2) == 0) ||
       (paVar15->role != 0 && urole.malenum != paVar15->role)) {
      iVar6 = -(*(uint *)&obj->field_0x4a & 1);
    }
    else {
      iVar6 = 1;
    }
    recharge(poVar13,iVar6);
    update_inventory();
    break;
  case 'H':
    level_tele();
    break;
  case 'I':
    bVar5 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
    iVar6 = n_dgns;
    if ((bVar5 == '\0') || (u.ushops[0] == '\0')) {
      local_b0 = &u.uz;
      items = (nh_menuitem *)malloc((long)n_dgns * 0x10c);
      uVar19 = 0;
      if (0 < iVar6) {
        uVar19 = (ulong)(uint)iVar6;
      }
      iVar6 = 0;
      uVar18 = 0;
      lVar10 = 0;
      do {
        lVar16 = 0;
        pcVar11 = pl_fruit + lVar10 * 0x38 + 8;
        do {
          uVar7 = (uint)uVar18;
          if ((lVar10 - uVar19) + lVar16 == 0) {
            if (uVar7 < 2) {
              free(items);
            }
            else {
              iVar6 = display_menu(items,uVar7,"Open a portal to which dungeon?",1,(int *)&pseudo);
              free(items);
              if (iVar6 < 1) goto LAB_0014b15b;
              iVar6 = (int)pseudo.nobj + -1;
            }
            cVar3 = (char)iVar6;
            iVar21 = dungeons[iVar6].depth_start;
            unused_known = cVar3;
            sVar4 = depth(local_b0);
            local_b1 = *(xchar *)((long)iVar6 * 0x38 + 0x316e2c + (ulong)(iVar21 < sVar4) * 2);
            if ((((u.uhave._0_1_ & 1) == 0) && (u.uz.dnum != dungeon_topology.d_astral_level.dnum))
               && (dungeon_topology.d_astral_level.dnum != cVar3 && u.uz.dnum != cVar3)) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014b320;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014b31b;
LAB_0014b387:
                pcVar11 = "You are surrounded by a shimmering sphere!";
              }
              else {
LAB_0014b31b:
                if (ublindf != (obj *)0x0) {
LAB_0014b320:
                  if (ublindf->oartifact == '\x1d') goto LAB_0014b387;
                }
                pcVar11 = "You feel weightless for a moment.";
              }
              pline(pcVar11);
              goto_level((d_level *)&unused_known,'\0','\0','\0');
              return 1;
            }
            goto LAB_0014b296;
          }
          lVar16 = lVar16 + 1;
          pcVar12 = pcVar11 + 0x38;
          pcVar1 = pcVar11 + 0x66;
          pcVar11 = pcVar12;
        } while (*pcVar1 == '\0');
        local_a8 = lVar10 + lVar16;
        items[uVar18].id = (int)local_a8;
        items[uVar18].accel = '\0';
        items[uVar18].role = MI_NORMAL;
        items[uVar18].selected = '\0';
        local_a0 = items;
        strcpy(items[uVar18].caption,pcVar12);
        uVar18 = (ulong)(uVar7 + 1);
        iVar6 = (int)lVar10 + -1 + (int)lVar16;
        lVar10 = local_a8;
        items = local_a0;
      } while( true );
    }
LAB_0014b296:
    pcVar11 = "You feel very disoriented for a moment.";
    goto LAB_0014b168;
  case 'J':
    enlightenment(0);
    break;
  case 'K':
    poVar13 = mksobj(level,1,'\x01','\0');
    if (poVar13 != (obj *)0x0) {
      uVar8 = *(uint *)&obj->field_0x4a & 2;
      uVar7 = *(uint *)&poVar13->field_0x4a;
      *(uint *)&poVar13->field_0x4a = uVar7 & 0xfffffffd | uVar8;
      uVar9 = *(uint *)&obj->field_0x4a & 1;
      *(uint *)&poVar13->field_0x4a = uVar7 & 0xfffffffc | uVar8 | uVar9;
      *(uint *)&poVar13->field_0x4a =
           uVar7 & 0xffffffbc | uVar8 | uVar9 | *(uint *)&obj->field_0x4a & 0x40;
      if ((*(uint *)&obj->field_0x4a & 2) == 0) {
        if ((*(uint *)&obj->field_0x4a & 1) != 0) {
          if ('\0' < poVar13->spe) {
            poVar13->spe = '\0';
          }
          goto LAB_0014b1a5;
        }
        iVar6 = 5;
      }
      else {
        if (poVar13->spe < '\0') {
          poVar13->spe = '\0';
        }
        iVar6 = 10;
      }
      iVar6 = rnd(iVar6);
      poVar13->quan = poVar13->quan + iVar6;
LAB_0014b1a5:
      uVar7 = weight(poVar13);
      poVar13->owt = uVar7;
      pcVar11 = aobjnam(poVar13,"fall");
      hold_another_object(poVar13,"Suddenly %s out.",pcVar11,(char *)0x0);
      return 1;
    }
    goto LAB_0014b15b;
  case 'L':
    if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 8) == 0)) {
      if (paVar15 == artilist + 0x1a) {
        if (uball != obj && uball != (obj *)0x0) {
          pcVar11 = yname(uball);
          pline("You are liberated from %s!",pcVar11);
          unpunish();
        }
        if (uball == (obj *)0x0) {
          poVar13 = mkobj(level,'\x10','\x01');
          setworn(poVar13,0x400000);
          setworn(obj,0x200000);
          uball->spe = '\x01';
          if ((u._1052_1_ & 1) == 0) {
            placebc();
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014ad7d;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014ad78;
            }
            else {
LAB_0014ad78:
              if (ublindf != (obj *)0x0) {
LAB_0014ad7d:
                if (ublindf->oartifact == '\x1d') goto LAB_0014ad8b;
              }
              set_bc(1);
            }
LAB_0014ad8b:
            newsym((int)u.ux,(int)u.uy);
          }
          pcVar11 = xname(obj);
          pline("Your %s chains itself to you!",pcVar11);
        }
      }
      pcVar11 = "Your body begins to feel less solid.";
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
        pcVar11 = "You feel one with the spirit world.";
      }
      pline(pcVar11);
      iVar6 = rnd(100);
      incr_itimeout(&u.uprops[0x3e].intrinsic,(ulong)(iVar6 + 0x32));
      uVar7 = u.uprops[0x3e].intrinsic;
LAB_0014ab74:
      obj->age = obj->age + uVar7;
      return 1;
    }
LAB_0014b15b:
    if (obj->where == '\x03') {
      pcVar11 = "You feel a surge of power, but nothing seems to happen.";
LAB_0014b168:
      pline(pcVar11);
    }
  }
  return 1;
}

Assistant:

static int arti_invoke(struct obj *obj)
{
    const struct artifact *oart = get_artifact(obj);

    if (!oart || !oart->inv_prop) {
        if (obj->oclass == WAND_CLASS)
            return do_break_wand(obj);
        else if (obj->oclass == GEM_CLASS || obj->oclass == TOOL_CLASS)
            return dorub(obj);
	else if (obj->otyp == CRYSTAL_BALL)
	    use_crystal_ball(obj);
	else if (obj->otyp == AMULET_OF_YENDOR ||
		 obj->otyp == FAKE_AMULET_OF_YENDOR)
	    /* The Amulet is not technically an artifact
	     * in the usual sense... */
	    return invoke_amulet(obj);
	else
	    pline("Nothing happens.");
	return 1;
    }

    if (oart->inv_prop > LAST_PROP) {
	/* It's a special power, not "just" a property */
	if (obj->age > moves) {
	    /* the artifact is tired :-) */
	    pline("You feel that %s %s ignoring you.",
		     the(xname(obj)), otense(obj, "are"));
	    /* and just got more so; patience is essential... */
	    obj->age += (long) dice(3,10);
	    return 1;
	}
	obj->age = moves + rnz(100);

	switch(oart->inv_prop) {
	case TAMING: {
	    struct obj pseudo;
	    boolean unused_known;

	    pseudo = zeroobj;	/* neither cursed nor blessed */
	    pseudo.otyp = SCR_TAMING;
	    seffects(&pseudo, &unused_known);
	    break;
	  }
	case HEALING: {
	    int healamt = (u.uhpmax + 1 - u.uhp) / 2;
	    long creamed = (long)u.ucreamed;

	    if (Upolyd) healamt = (u.mhmax + 1 - u.mh) / 2;
	    if (healamt || Sick || Slimed || Blinded > creamed)
		pline("You feel better.");
	    else
		goto nothing_special;
	    if (healamt > 0) {
		if (Upolyd) u.mh += healamt;
		else u.uhp += healamt;
	    }
	    if (Sick) make_sick(0L,NULL,FALSE,SICK_ALL);
	    if (Slimed) Slimed = 0L;
	    if (Blinded > creamed) make_blinded(creamed, FALSE);
	    iflags.botl = 1;
	    break;
	  }
	case ENERGY_BOOST: {
	    int epboost = (u.uenmax + 1 - u.uen) / 2;
	    if (epboost > 120) epboost = 120;		/* arbitrary */
	    else if (epboost < 12) epboost = u.uenmax - u.uen;
	    if (epboost) {
		pline("You feel re-energized.");
		u.uen += epboost;
		iflags.botl = 1;
	    } else
		goto nothing_special;
	    break;
	  }
	case UNTRAP: {
	    if (!untrap(TRUE)) {
		obj->age = 0; /* don't charge for changing their mind */
		return 0;
	    }
	    break;
	  }
	case CHARGE_OBJ: {
	    struct obj *otmp = getobj(recharge_type, "charge", NULL);
	    boolean b_effect;

	    if (!otmp) {
		obj->age = 0;
		return 0;
	    }
	    b_effect = obj->blessed &&
		(Role_switch == oart->role || !oart->role);
	    recharge(otmp, b_effect ? 1 : obj->cursed ? -1 : 0);
	    update_inventory();
	    break;
	  }
	case LEV_TELE:
	    level_tele();
	    break;
	case CREATE_PORTAL: {
	    int i, num_ok_dungeons, last_ok_dungeon = 0;
	    d_level newlev;
	    extern int n_dgns; /* from dungeon.c */
	    struct nh_menuitem *items;

	    /* Prevent branchporting from the Black Market shop. */
	    if (Is_blackmarket(&u.uz) && *u.ushops) {
		pline("You feel very disoriented for a moment.");
		break;
	    }

	    items = malloc(n_dgns * sizeof(struct nh_menuitem));

	    num_ok_dungeons = 0;
	    for (i = 0; i < n_dgns; i++) {
		if (!dungeons[i].dunlev_ureached)
		    continue;
		items[num_ok_dungeons].id = i+1;
		items[num_ok_dungeons].accel = 0;
		items[num_ok_dungeons].role = MI_NORMAL;
		items[num_ok_dungeons].selected = FALSE;
		strcpy(items[num_ok_dungeons].caption, dungeons[i].dname);
		num_ok_dungeons++;
		last_ok_dungeon = i;
	    }

	    if (num_ok_dungeons > 1) {
		/* more than one entry; display menu for choices */
		int n;
		int selected[1];

		n = display_menu(items, num_ok_dungeons, "Open a portal to which dungeon?", PICK_ONE, selected);
		free(items);
		if (n <= 0)
		    goto nothing_special;
		
		i = selected[0] - 1;
	    } else {
		free(items);
		i = last_ok_dungeon;	/* also first & only OK dungeon */
	    }

	    /*
	     * i is now index into dungeon structure for the new dungeon.
	     * Find the closest level in the given dungeon, open
	     * a use-once portal to that dungeon and go there.
	     * The closest level is either the entry or dunlev_ureached.
	     */
	    newlev.dnum = i;
	    if (dungeons[i].depth_start >= depth(&u.uz))
		newlev.dlevel = dungeons[i].entry_lev;
	    else
		newlev.dlevel = dungeons[i].dunlev_ureached;
	    if (u.uhave.amulet || In_endgame(&u.uz) || In_endgame(&newlev) ||
	       newlev.dnum == u.uz.dnum) {
		pline("You feel very disoriented for a moment.");
	    } else {
		if (!Blind) pline("You are surrounded by a shimmering sphere!");
		else pline("You feel weightless for a moment.");
		goto_level(&newlev, FALSE, FALSE, FALSE);
	    }
	    break;
	  }
	case ENLIGHTENING:
	    enlightenment(0);
	    break;
	case CREATE_AMMO: {
	    struct obj *otmp = mksobj(level, ARROW, TRUE, FALSE);

	    if (!otmp) goto nothing_special;
	    otmp->blessed = obj->blessed;
	    otmp->cursed = obj->cursed;
	    otmp->bknown = obj->bknown;
	    if (obj->blessed) {
		if (otmp->spe < 0) otmp->spe = 0;
		otmp->quan += rnd(10);
	    } else if (obj->cursed) {
		if (otmp->spe > 0) otmp->spe = 0;
	    } else
		otmp->quan += rnd(5);
	    otmp->owt = weight(otmp);
	    hold_another_object(otmp, "Suddenly %s out.", aobjnam(otmp, "fall"), NULL);
	    break;
	  }
	case PHASING:	/* walk through walls and stone like a xorn */
	    if (Passes_walls) goto nothing_special;
	    if (oart == &artilist[ART_IRON_BALL_OF_LIBERATION]) {
		if (Punished && obj != uball) {
		    pline("You are liberated from %s!", yname(uball));
		    unpunish(); /* remove a mundane heavy iron ball */
		}

		if (!Punished) {
		    setworn(mkobj(level, CHAIN_CLASS, TRUE), W_CHAIN);
		    setworn(obj, W_BALL);
		    uball->spe = 1;	/* attach the Iron Ball of Liberation */
		    if (!u.uswallow) {
			placebc();
			if (Blind) set_bc(1);	/* set up ball and chain variables */
			newsym(u.ux, u.uy);	/* see ball&chain if can't see self */
		    }
		    pline("Your %s chains itself to you!", xname(obj));
		}
	    }
	    if (!Hallucination)
		pline("Your body begins to feel less solid.");
	    else
		pline("You feel one with the spirit world.");
	    incr_itimeout(&Phasing, (50 + rnd(100)));
	    obj->age += Phasing; /* Time begins after phasing ends */
	    break;
	}
    } else {
	long eprop = (u.uprops[oart->inv_prop].extrinsic ^= W_ARTI),
	     iprop = u.uprops[oart->inv_prop].intrinsic;
	boolean on = (eprop & W_ARTI) != 0; /* true if invoked prop just set */

	if (on && obj->age > moves) {
	    /* the artifact is tired :-) */
	    u.uprops[oart->inv_prop].extrinsic ^= W_ARTI;
	    pline("You feel that %s %s ignoring you.",
		     the(xname(obj)), otense(obj, "are"));
	    /* can't just keep repeatedly trying */
	    obj->age += (long) dice(3,10);
	    return 1;
	} else if (!on) {
	    /* when turning off property, determine downtime */
	    /* arbitrary for now until we can tune this -dlc */
	    obj->age = moves + rnz(100);
	}

	if ((eprop & ~W_ARTI) || iprop) {
nothing_special:
	    /* you had the property from some other source too */
	    if (carried(obj))
		pline("You feel a surge of power, but nothing seems to happen.");
	    return 1;
	}
	switch(oart->inv_prop) {
	case CONFLICT:
	    if (on) pline("You feel like a rabble-rouser.");
	    else pline("You feel the tension decrease around you.");
	    break;
	case LEVITATION:
	    if (on) {
		float_up();
		spoteffects(FALSE);
	    } else float_down(I_SPECIAL|TIMEOUT, W_ARTI);
	    break;
	case INVIS:
	    if (BInvis || Blind) goto nothing_special;
	    newsym(u.ux, u.uy);
	    if (on)
		pline("Your body takes on a %s transparency...",
		     Hallucination ? "normal" : "strange");
	    else
		pline("Your body seems to unfade...");
	    break;
	}
    }

    return 1;
}